

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alSourceiv(void)

{
  uint32 name_00;
  ALenum param_00;
  uint32 numvals_00;
  int32 iVar1;
  ALint *origvalues_00;
  ALint *values_00;
  uint local_254;
  uint32 i;
  ALint *values;
  uint32 numvals;
  ALint *origvalues;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    origvalues_00 = (ALint *)IO_PTR();
    numvals_00 = IO_UINT32();
    values_00 = (ALint *)get_ioblob((ulong)numvals_00 << 2);
    for (local_254 = 0; local_254 < numvals_00; local_254 = local_254 + 1) {
      iVar1 = IO_INT32();
      values_00[local_254] = iVar1;
    }
    if (io_failure == 0) {
      visit_alSourceiv((CallerInfo *)&param,name_00,param_00,origvalues_00,numvals_00,values_00);
    }
  }
  return;
}

Assistant:

static void decode_alSourceiv(void)
{
    IO_START(alSourceiv);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    const ALint *origvalues = (ALint *) IO_PTR();
    const uint32 numvals = IO_UINT32();
    ALint *values = (ALint *) get_ioblob(sizeof (ALint) * numvals);
    uint32 i;

    for (i = 0; i < numvals; i++) {
        values[i] = IO_INT32();
    }

    if (!io_failure) visit_alSourceiv(&callerinfo, name, param, origvalues, numvals, values);

    IO_END();
}